

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::addMapPointer(CLIntercept *this,void *ptr,cl_map_flags flags,size_t size)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  double __x;
  void *local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (ptr == (void *)0x0) {
    return;
  }
  __mutex = &this->m_Mutex;
  local_50 = ptr;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    uVar5 = std::__throw_system_error(iVar2);
    if (local_48[0] != (undefined1 *)size) {
      operator_delete(local_48[0]);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar5);
  }
  p_Var3 = (this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_MapPointerInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(void **)(p_Var3 + 1) >= ptr) {
        p_Var6 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(void **)(p_Var3 + 1) < ptr];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(void **)(p_Var6 + 1) <= ptr)) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"Ignoring duplicate mapped pointer.\n","");
      log(this,__x);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      goto LAB_00181c87;
    }
  }
  pmVar4 = std::
           map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
           ::operator[](&this->m_MapPointerInfoMap,&local_50);
  pmVar4->Flags = flags;
  pmVar4->Size = size;
LAB_00181c87:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void CLIntercept::addMapPointer(
    const void* ptr,
    const cl_map_flags flags,
    const size_t size )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_MapPointerInfoMap.find(ptr) != m_MapPointerInfoMap.end() )
        {
            log( "Ignoring duplicate mapped pointer.\n" );
        }
        else
        {
            SMapPointerInfo&    mapPointerInfo = m_MapPointerInfoMap[ptr];

            mapPointerInfo.Flags = flags;
            mapPointerInfo.Size = size;
        }
    }
}